

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.h
# Opt level: O2

bool __thiscall cmValue::IsSet(cmValue *this)

{
  bool bVar1;
  
  if ((this->Value != (string *)0x0) && (this->Value->_M_string_length != 0)) {
    bVar1 = IsNOTFOUND(this);
    return !bVar1;
  }
  return false;
}

Assistant:

bool IsEmpty() const noexcept
  {
    return this->Value == nullptr || this->Value->empty();
  }